

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

mg_str * mg_get_http_header(http_message *hm,char *name)

{
  int iVar1;
  size_t len_00;
  mg_str *pmVar2;
  mg_str *v;
  mg_str *h;
  size_t len;
  size_t i;
  char *name_local;
  http_message *hm_local;
  
  len_00 = strlen(name);
  len = 0;
  while( true ) {
    if (hm->header_names[len].len == 0) {
      return (mg_str *)0x0;
    }
    pmVar2 = hm->header_names + len;
    if (((pmVar2->p != (char *)0x0) && (pmVar2->len == len_00)) &&
       (iVar1 = mg_ncasecmp(pmVar2->p,name,len_00), iVar1 == 0)) break;
    len = len + 1;
  }
  return hm->header_values + len;
}

Assistant:

struct mg_str *mg_get_http_header(struct http_message *hm, const char *name) {
    size_t i, len = strlen(name);

    for (i = 0; hm->header_names[i].len > 0; i++) {
        struct mg_str *h = &hm->header_names[i], *v = &hm->header_values[i];
        if (h->p != NULL && h->len == len && !mg_ncasecmp(h->p, name, len))
            return v;
    }

    return NULL;
}